

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Image.c
# Opt level: O0

DdNode * Llb_Nonlin4Image(DdManager *dd,Vec_Ptr_t *vParts,DdNode *bCurrent,Vec_Int_t *vVars2Q)

{
  int iVar1;
  int iVar2;
  Llb_Mgr_t_conflict *p_00;
  DdNode *n;
  int local_64;
  int nReorders;
  int i;
  DdNode *bTemp;
  DdNode *bFunc;
  Llb_Mgr_t_conflict *p;
  Llb_Prt_t *pPart2;
  Llb_Prt_t *pPart1;
  Llb_Prt_t *pPart;
  Vec_Int_t *vVars2Q_local;
  DdNode *bCurrent_local;
  Vec_Ptr_t *vParts_local;
  DdManager *dd_local;
  
  pPart = (Llb_Prt_t *)vVars2Q;
  vVars2Q_local = (Vec_Int_t *)bCurrent;
  bCurrent_local = (DdNode *)vParts;
  vParts_local = (Vec_Ptr_t *)dd;
  p_00 = Llb_Nonlin4Alloc(dd,vParts,bCurrent,vVars2Q,0);
  for (local_64 = 0; local_64 < p_00->iPartFree; local_64 = local_64 + 1) {
    pPart1 = Llb_MgrPart(p_00,local_64);
    if ((pPart1 != (Llb_Prt_t *)0x0) &&
       (iVar1 = Llb_Nonlin4HasSingletonVars(p_00,pPart1), iVar1 != 0)) {
      Llb_Nonlin4Quantify1(p_00,pPart1);
    }
  }
  Llb_Nonlin4RecomputeScores(p_00);
  while( true ) {
    iVar1 = Llb_Nonlin4NextPartitions(p_00,&pPart2,(Llb_Prt_t **)&p);
    if (iVar1 == 0) {
      bTemp = Cudd_ReadOne(p_00->dd);
      Cudd_Ref(bTemp);
      for (local_64 = 0; local_64 < p_00->iPartFree; local_64 = local_64 + 1) {
        pPart1 = Llb_MgrPart(p_00,local_64);
        if (pPart1 != (Llb_Prt_t *)0x0) {
          n = Cudd_bddAnd(p_00->dd,bTemp,pPart1->bFunc);
          Cudd_Ref(n);
          Cudd_RecursiveDeref(p_00->dd,bTemp);
          bTemp = n;
        }
      }
      Llb_Nonlin4Free(p_00);
      Cudd_Deref(bTemp);
      return bTemp;
    }
    iVar1 = Cudd_ReadReorderings((DdManager *)vParts_local);
    iVar2 = Llb_Nonlin4Quantify2(p_00,pPart2,(Llb_Prt_t *)p);
    if (iVar2 == 0) break;
    iVar2 = Cudd_ReadReorderings((DdManager *)vParts_local);
    if (iVar1 < iVar2) {
      Llb_Nonlin4RecomputeScores(p_00);
    }
  }
  Llb_Nonlin4Free(p_00);
  return (DdNode *)0x0;
}

Assistant:

DdNode * Llb_Nonlin4Image( DdManager * dd, Vec_Ptr_t * vParts, DdNode * bCurrent, Vec_Int_t * vVars2Q )
{
    Llb_Prt_t * pPart, * pPart1, * pPart2;
    Llb_Mgr_t * p;
    DdNode * bFunc, * bTemp;
    int i, nReorders;
    // start the manager
    p = Llb_Nonlin4Alloc( dd, vParts, bCurrent, vVars2Q, 0 );
    // remove singles
    Llb_MgrForEachPart( p, pPart, i )
        if ( Llb_Nonlin4HasSingletonVars(p, pPart) )
            Llb_Nonlin4Quantify1( p, pPart );
    // compute scores
    Llb_Nonlin4RecomputeScores( p );
    // iteratively quantify variables
    while ( Llb_Nonlin4NextPartitions(p, &pPart1, &pPart2) )
    {
        nReorders = Cudd_ReadReorderings(dd);
        if ( !Llb_Nonlin4Quantify2( p, pPart1, pPart2 ) )
        {
            Llb_Nonlin4Free( p );
            return NULL;
        }
        if ( nReorders < Cudd_ReadReorderings(dd) )
            Llb_Nonlin4RecomputeScores( p );
//        else
//            Llb_Nonlin4VerifyScores( p );
    }
    // load partitions
    bFunc = Cudd_ReadOne(p->dd);   Cudd_Ref( bFunc );
    Llb_MgrForEachPart( p, pPart, i )
    {
        bFunc = Cudd_bddAnd( p->dd, bTemp = bFunc, pPart->bFunc );   Cudd_Ref( bFunc );
        Cudd_RecursiveDeref( p->dd, bTemp );
    }
//    nSuppMax = p->nSuppMax;
    Llb_Nonlin4Free( p );
//printf( "\n" );
    // return
    Cudd_Deref( bFunc );
    return bFunc;
}